

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O0

ObjTypeSpecFldInfo * __thiscall
ObjTypeSpecFldInfoArray::GetInfo
          (ObjTypeSpecFldInfoArray *this,FunctionBody *functionBody,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<ObjTypeSpecFldInfo> **ppWVar6;
  ObjTypeSpecFldInfo **ppOVar7;
  nullptr_t local_30;
  WriteBarrierPtr<ObjTypeSpecFldInfo> local_28;
  uint local_1c;
  FunctionBody *pFStack_18;
  uint index_local;
  FunctionBody *functionBody_local;
  ObjTypeSpecFldInfoArray *this_local;
  
  local_1c = index;
  pFStack_18 = functionBody;
  functionBody_local = (FunctionBody *)this;
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c4,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__((WriteBarrierPtr *)this);
  if (*ppWVar6 != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(pFStack_18);
    if (uVar3 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4c5,
                         "(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount)"
                         ,
                         "this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  uVar3 = local_1c;
  uVar4 = Js::FunctionBody::GetInlineCacheCount(pFStack_18);
  if (uVar4 <= uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c6,"(index < functionBody->GetInlineCacheCount())",
                       "index < functionBody->GetInlineCacheCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__((WriteBarrierPtr *)this);
  if (*ppWVar6 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    local_30 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::WriteBarrierPtr(&local_28,&local_30);
  }
  else {
    ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__((WriteBarrierPtr *)this);
    Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::WriteBarrierPtr(&local_28,*ppWVar6 + local_1c);
  }
  ppOVar7 = Memory::WriteBarrierPtr::operator_cast_to_ObjTypeSpecFldInfo__
                      ((WriteBarrierPtr *)&local_28);
  return *ppOVar7;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfoArray::GetInfo(Js::FunctionBody *const functionBody, const uint index) const
{
    Assert(functionBody);
    Assert(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount);
    Assert(index < functionBody->GetInlineCacheCount());
    return this->infoArray ? this->infoArray[index] : nullptr;
}